

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorisedJoin.cpp
# Opt level: O2

void __thiscall
FactorisedJoin::getRelationOrdering(FactorisedJoin *this,int *left,DTreeNode *node,int *ordering)

{
  double dVar1;
  int iVar2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar3;
  Database pTVar4;
  pointer ppVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> values;
  allocator_type local_49;
  _Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  
  iVar2 = node->_id;
  uVar10 = (ulong)((long)this->_ids[iVar2].
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)this->_ids[iVar2].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar9 = (int)uVar10;
  if (iVar9 == 1) {
    *ordering = 0;
  }
  else {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_48
               ,(long)iVar9,&local_49);
    pvVar3 = this->_ids;
    pTVar4 = this->_data;
    uVar6 = 0;
    uVar11 = 0;
    if (0 < iVar9) {
      uVar11 = uVar10 & 0xffffffff;
    }
    pdVar8 = &(local_48._M_impl.super__Vector_impl_data._M_start)->second;
    for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
      ppVar5 = pvVar3[iVar2].
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar9 = ppVar5[uVar6].first;
      dVar1 = pTVar4[iVar9].super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
              super__Vector_impl_data._M_start[left[iVar9]][ppVar5[uVar6].second];
      ((pair<int,_double> *)(pdVar8 + -1))->first = (int)uVar6;
      *pdVar8 = dVar1;
      pdVar8 = pdVar8 + 2;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FactorisedJoin::sort_pred>>
              (local_48._M_impl.super__Vector_impl_data._M_start,
               local_48._M_impl.super__Vector_impl_data._M_finish);
    for (lVar7 = 0; uVar11 * 4 != lVar7; lVar7 = lVar7 + 4) {
      *(int *)((long)ordering + lVar7) =
           (&(local_48._M_impl.super__Vector_impl_data._M_start)->first)[lVar7];
    }
    std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    ~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void FactorisedJoin::getRelationOrdering(int* left, DTreeNode* node, int* ordering)
{
    int nodeID = node->_id;
    int numberOfRelations = _ids[nodeID].size();

    if (numberOfRelations == 1)
    {
        ordering[0] = 0;
        return;
    }

    vector<pair<int, double> > values(numberOfRelations);

    for (int k = 0; k < numberOfRelations; ++k)
    {
        int i = _ids[nodeID][k].first;
        int j = _ids[nodeID][k].second;
        values[k] = make_pair(k, _data[i][left[i]][j]);
    }

    sort(values.begin(), values.end(), sort_pred());

    for (int k = 0; k < numberOfRelations; ++k)
        ordering[k] = values[k].first;
}